

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ufs_file_base.cpp
# Opt level: O1

int __thiscall foxxll::ufs_file_base::unlink(ufs_file_base *this,char *__name)

{
  int extraout_EAX;
  int iVar1;
  ostream *poVar2;
  int *piVar3;
  char *pcVar4;
  io_error *this_00;
  ostringstream msg;
  string sStack_1a8;
  Logger local_188;
  
  if (this->is_device_ == true) {
    tlx::Logger::Logger(&local_188);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_188,"unlink() path=",0xe);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_188,(this->filename_)._M_dataplus._M_p,
               (this->filename_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_188," skipped as file is device node",0x1f);
    tlx::Logger::~Logger(&local_188);
    iVar1 = extraout_EAX;
  }
  else {
    iVar1 = ::unlink((this->filename_)._M_dataplus._M_p);
    if (iVar1 != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_188);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_188,"Error in ",9);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_188,"void foxxll::ufs_file_base::unlink()",0x24);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_188," : ",3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_188,"unlink() path=",0xe)
      ;
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_188,(this->filename_)._M_dataplus._M_p,
                          (this->filename_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," fd=",4);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,this->file_des_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," : ",3);
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      std::operator<<(poVar2,pcVar4);
      this_00 = (io_error *)__cxa_allocate_exception(0x20);
      std::__cxx11::stringbuf::str();
      io_error::io_error(this_00,&sStack_1a8);
      __cxa_throw(this_00,&io_error::typeinfo,std::ios_base::failure[abi:cxx11]::~failure);
    }
  }
  return iVar1;
}

Assistant:

void ufs_file_base::unlink()
{
    if (is_device_) {
        TLX_LOG1 << "unlink() path=" << filename_
                 << " skipped as file is device node";
        return;
    }

    if (::unlink(filename_.c_str()) != 0)
        FOXXLL_THROW_ERRNO(io_error, "unlink() path=" << filename_ << " fd=" << file_des_);
}